

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

double TasGrid::Optimizer::getNextNode<(TasGrid::TypeOneDRule)6>
                 (vector<double,_std::allocator<double>_> *nodes)

{
  OptimizerResult OVar1;
  CurrentNodes<(TasGrid::TypeOneDRule)6> local_20;
  
  ::std::vector<double,_std::allocator<double>_>::vector(&local_20.nodes,nodes);
  OVar1 = computeMaximum<(TasGrid::TypeOneDRule)6>(&local_20);
  if (local_20.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return OVar1.node;
}

Assistant:

double getNextNode(std::vector<double> const &nodes){
    return computeMaximum(CurrentNodes<rule>(nodes)).node;
}